

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O2

void __thiscall
snestistics::AnnotationResolver::load(AnnotationResolver *this,istream *input,string *error_file)

{
  int iVar1;
  char *__rhs;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  Pointer start;
  string comment;
  Hint ta;
  _Alloc_hider local_1920;
  undefined1 local_1918 [24];
  _Alloc_hider local_1900;
  size_type local_18f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18f0;
  bool local_18e0;
  _Alloc_hider local_18d8;
  size_type local_18d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18c8;
  Pointer local_18b8;
  Pointer local_18b4;
  string useComment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1858;
  char name [1024];
  char mycomment [1024];
  char buf [4096];
  
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  useComment._M_dataplus._M_p = (pointer)&useComment.field_2;
  useComment._M_string_length = 0;
  useComment.field_2._M_local_buf[0] = '\0';
  memset(name,0,0x400);
  uVar2 = 1;
  bVar3 = false;
  do {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
      std::__cxx11::string::~string((string *)&useComment);
      std::__cxx11::string::~string((string *)&comment);
      return;
    }
    std::istream::getline((char *)input,(long)buf);
    if (buf[0] != '\0') {
      if (buf[0] == '#') {
        std::__cxx11::string::assign((char *)&useComment);
      }
      else if (buf[0] == ';') {
        __rhs = buf + 1;
        if (buf[1] == ' ') {
          __rhs = buf + 2;
        }
        if (buf[1] == '\0') {
          __rhs = "";
        }
        if (comment._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&comment);
        }
        else {
          std::operator+(&local_1878,&comment,"\n");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ta,
                         &local_1878,__rhs);
          std::__cxx11::string::operator=((string *)&comment,(string *)&ta);
          std::__cxx11::string::~string((string *)&ta);
          std::__cxx11::string::~string((string *)&local_1878);
          bVar3 = true;
        }
      }
      else if (buf[0] != '@') {
        iVar1 = __isoc99_sscanf(buf,"hint %06X %s",&start,name);
        if (iVar1 < 1) {
          ta.hints = '\0';
          ta._1_3_ = 0;
          local_1920._M_p = local_1918 + 8;
          local_1918._0_8_ = 0;
          local_1918[8] = '\0';
          local_1900._M_p = (pointer)&local_18f0;
          local_18f8 = 0;
          local_18f0._M_local_buf[0] = '\0';
          local_18e0 = false;
          local_18d8._M_p = (pointer)&local_18c8;
          local_18d0 = 0;
          local_18c8._M_local_buf[0] = '\0';
          iVar1 = __isoc99_sscanf(buf,"function %06X %06X %s",&local_18b8,&local_18b4,name);
          if (iVar1 < 1) {
            iVar1 = __isoc99_sscanf(buf,"line %06X",&local_18b8);
            if (iVar1 < 1) {
              iVar1 = __isoc99_sscanf(buf,"comment %06X \"%[^\"]",&local_18b8,mycomment);
              if (iVar1 < 1) {
                iVar1 = __isoc99_sscanf(buf,"label %06X %s",&local_18b8,name);
                if (0 < iVar1) goto LAB_0012bd58;
                iVar1 = __isoc99_sscanf(buf,"data %06X %06X %s",&local_18b8,&local_18b4,name);
                if (iVar1 < 1) {
                  printf("%s:%d: Not supported format!\n\t\'%s\'\n",(error_file->_M_dataplus)._M_p,
                         (ulong)uVar2,buf);
                  exit(99);
                }
                ta.hints = '\x02';
                ta._1_3_ = 0;
              }
              else {
                ta.hints = '\x03';
                ta._1_3_ = 0;
                if (comment._M_string_length == 0) {
                  std::__cxx11::string::assign((char *)&comment);
                }
                else {
                  std::operator+(&local_1858,&comment,"\n");
                  std::operator+(&local_1878,&local_1858,mycomment);
                  std::__cxx11::string::operator=((string *)&comment,(string *)&local_1878);
                  std::__cxx11::string::~string((string *)&local_1878);
                  std::__cxx11::string::~string((string *)&local_1858);
                  bVar3 = true;
                }
                std::__cxx11::string::assign((char *)&useComment);
                local_18b4 = local_18b8;
              }
            }
            else {
LAB_0012bd58:
              ta.hints = '\x03';
              ta._1_3_ = 0;
              local_18b4 = local_18b8;
            }
          }
          else {
            ta.hints = '\x01';
            ta._1_3_ = 0;
          }
          std::__cxx11::string::_M_assign((string *)&local_18d8);
          std::__cxx11::string::_M_assign((string *)&local_1900);
          local_18e0 = bVar3;
          std::__cxx11::string::assign((char *)&local_1920);
          std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::push_back
                    (&this->_annotations,(value_type *)&ta);
          comment._M_string_length = 0;
          bVar3 = false;
          *comment._M_dataplus._M_p = '\0';
          useComment._M_string_length = 0;
          *useComment._M_dataplus._M_p = '\0';
          name[0] = '\0';
          Annotation::~Annotation((Annotation *)&ta);
        }
        else {
          iVar1 = bcmp(name,"jump_is_jsr",0xc);
          if (iVar1 == 0) {
            ta.hints = '\x01';
          }
          else {
            auVar4[0] = -(name[0] == 'j');
            auVar4[1] = -(name[1] == 'u');
            auVar4[2] = -(name[2] == 'm');
            auVar4[3] = -(name[3] == 'p');
            auVar4[4] = -(name[4] == '_');
            auVar4[5] = -(name[5] == 'i');
            auVar4[6] = -(name[6] == 's');
            auVar4[7] = -(name[7] == '_');
            auVar4[8] = -(name[8] == 'j');
            auVar4[9] = -(name[9] == 's');
            auVar4[10] = -(name[10] == 'r');
            auVar4[0xb] = -(name[0xb] == '_');
            auVar4[0xc] = -(name[0xc] == 'i');
            auVar4[0xd] = -(name[0xd] == 's');
            auVar4[0xe] = -(name[0xe] == 'h');
            auVar4[0xf] = -(name[0xf] == '\0');
            if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
              ta.hints = '\x02';
            }
            else {
              iVar1 = bcmp(name,"jsr_is_jmp",0xb);
              if (iVar1 == 0) {
                ta.hints = '\x04';
              }
              else {
                iVar1 = bcmp(name,"branch_always",0xe);
                if (iVar1 == 0) {
                  ta.hints = '\b';
                }
                else {
                  iVar1 = bcmp(name,"branch_never",0xd);
                  if (iVar1 == 0) {
                    ta.hints = '\x10';
                  }
                  else {
                    iVar1 = bcmp(name,"annotate_merge",0xf);
                    if (iVar1 == 0) {
                      ta.hints = ' ';
                    }
                    else {
                      printf("Unknown hint \'%s\'\n",name);
                    }
                  }
                }
              }
            }
          }
          ta.location = start;
          std::vector<snestistics::Hint,_std::allocator<snestistics::Hint>_>::push_back
                    (&this->_hints,&ta);
        }
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void AnnotationResolver::load(std::istream &input, const std::string &error_file) {
	std::string comment;
	std::string useComment;
	bool comment_is_multiline = false;

	char name[1024]="";
	char mycomment[1024];

	Pointer start;

	int size;

	std::istream &f = input;

	int line_number = 0;
	
	while (!f.eof()) {
		line_number++;
		char buf[4096];
		f.getline(buf, 4096);

		size = 0;

		if (strlen(buf) == 0) {
			continue;
		}
		if (buf[0] == '@') {
			// meta-comment
			continue;
		} else if (buf[0] == ';') {
			const char *stripped = &buf[2];
			if (buf[1]=='\0') {
				stripped = "";
			} else if (buf[1] != ' ') {
				stripped = &buf[1];
			}
			if (!comment.empty()) {
				comment = comment + "\n" + stripped;
				comment_is_multiline = true;
			}
			else {
				comment = stripped;
			}
		}
		else if (buf[0] == '#') {
			useComment = &buf[2];
		} else if (sscanf(buf, "hint %06X %s", &start, (char*)&name) > 0) {

			Hint ta;
			if (strcmp(name, "jump_is_jsr")==0) {
				ta.hints = Hint::JUMP_IS_JSR;
			} else if (strcmp(name, "jump_is_jsr_ish")==0) {
				ta.hints = Hint::JUMP_IS_JSR_ISH;
			} else if (strcmp(name, "jsr_is_jmp")==0) {
				ta.hints = Hint::JSR_IS_JMP;
			} else if (strcmp(name, "branch_always") == 0) {
				ta.hints = Hint::BRANCH_ALWAYS;
			} else if (strcmp(name, "branch_never") == 0) {
				ta.hints = Hint::BRANCH_NEVER;
			} else if (strcmp(name, "annotate_merge") == 0) {
				ta.hints = Hint::ANNOTATE_MERGE;
			} else {
				printf("Unknown hint '%s'\n", name);
			}
			ta.location = start;
			_hints.push_back(ta);
			continue;
		} else {

			Annotation a;

			if (sscanf(buf, "function %06X %06X %s", &a.startOfRange, &a.endOfRange, name) > 0) {
				a.type = ANNOTATION_FUNCTION;
				const bool convert_single_byte_functions_to_labels = false;
				if (convert_single_byte_functions_to_labels && a.startOfRange == a.endOfRange) {
					a.type = ANNOTATION_LINE;
					printf("Function '%s' is only one byte long, treating as 'label' instead!\n", name);
					a.endOfRange = a.startOfRange;
				}
			} else if (sscanf(buf, "line %06X", &a.startOfRange) > 0) { // TODO: Does this makes sense?
				a.type = ANNOTATION_LINE;
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "comment %06X \"%[^\"]", &a.startOfRange, mycomment) > 0) {
				a.type = ANNOTATION_LINE;
				if (comment.empty()) {
					comment = mycomment;
				} else {
					comment = comment + "\n" + mycomment;
					comment_is_multiline = true;
				}
				useComment = "";
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "label %06X %s", &a.startOfRange, name) > 0) {
				a.type = ANNOTATION_LINE;
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "data %06X %06X %s", &a.startOfRange, &a.endOfRange, name) >0 ) {
				a.type = ANNOTATION_DATA;
			} else {
				printf("%s:%d: Not supported format!\n\t'%s'\n", error_file.c_str(), line_number, buf);
				exit(99);
			}


			a.useComment = useComment;
			a.comment = comment;
			a.comment_is_multiline = comment_is_multiline;
			a.name = name;
			_annotations.push_back(a);

			// Reset state
			comment.clear();
			useComment.clear();
			comment_is_multiline = false;
			name[0]='\0';
		}
	}
}